

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void mp::internal::
     ReadBinary<mp::internal::IdentityConverter,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
               (TextReader<fmt::Locale> *reader,NLHeader *header,
               NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *handler,int flags)

{
  pointer pcVar1;
  BinaryReader<mp::internal::IdentityConverter> bin_reader;
  undefined1 local_88 [32];
  long *local_68;
  long local_58 [3];
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  local_40;
  
  local_88._0_4_ = *(undefined4 *)&(reader->super_ReaderBase).ptr_;
  local_88._4_4_ = *(undefined4 *)((long)&(reader->super_ReaderBase).ptr_ + 4);
  local_88._8_4_ = *(undefined4 *)&(reader->super_ReaderBase).start_;
  local_88._12_4_ = *(undefined4 *)((long)&(reader->super_ReaderBase).start_ + 4);
  local_88._16_4_ = *(undefined4 *)&(reader->super_ReaderBase).end_;
  local_88._20_4_ = *(undefined4 *)((long)&(reader->super_ReaderBase).end_ + 4);
  local_88._24_4_ = *(undefined4 *)&(reader->super_ReaderBase).token_;
  local_88._28_4_ = *(undefined4 *)((long)&(reader->super_ReaderBase).token_ + 4);
  pcVar1 = (reader->super_ReaderBase).name_._M_dataplus._M_p;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + (reader->super_ReaderBase).name_._M_string_length);
  local_40.num_vars_and_exprs_ = 0;
  local_40.reader_ = (BinaryReader<mp::internal::IdentityConverter> *)local_88;
  local_40.header_ = header;
  local_40.handler_ = handler;
  local_40.flags_ = flags;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  ::Read(&local_40);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return;
}

Assistant:

void ReadBinary(TextReader<> &reader, const NLHeader &header,
                Handler &handler, int flags) {
  BinaryReader<InputConverter> bin_reader(reader);
  NLReader<BinaryReader<InputConverter>, Handler>(
        bin_reader, header, handler, flags).Read();
}